

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv.c
# Opt level: O2

void SharpYUVFilterRow_C(int16_t *A,int16_t *B,int len,uint16_t *best_y,uint16_t *out)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  ulong uVar5;
  uint16_t uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar5 = (ulong)(uint)len;
  if (len < 1) {
    uVar5 = 0;
  }
  for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    sVar1 = A[uVar9];
    sVar2 = A[uVar9 + 1];
    sVar3 = B[uVar9];
    sVar4 = B[uVar9 + 1];
    uVar8 = (uint)best_y[uVar9 * 2] +
            (sVar1 * 9 + (int)sVar4 + ((int)sVar3 + (int)sVar2) * 3 + 8 >> 4);
    uVar7 = 0x3ff;
    if (uVar8 < 0x3ff) {
      uVar7 = uVar8;
    }
    uVar6 = (uint16_t)uVar7;
    if ((int)uVar8 < 0) {
      uVar6 = 0;
    }
    out[uVar9 * 2] = uVar6;
    uVar8 = (uint)best_y[uVar9 * 2 + 1] +
            (((int)sVar4 + (int)sVar1) * 3 + sVar2 * 9 + (int)sVar3 + 8 >> 4);
    uVar7 = 0x3ff;
    if (uVar8 < 0x3ff) {
      uVar7 = uVar8;
    }
    uVar6 = (uint16_t)uVar7;
    if ((int)uVar8 < 0) {
      uVar6 = 0;
    }
    out[uVar9 * 2 + 1] = uVar6;
  }
  return;
}

Assistant:

static void SharpYUVFilterRow_C(const int16_t* A, const int16_t* B, int len,
                                const uint16_t* best_y, uint16_t* out) {
  int i;
  for (i = 0; i < len; ++i, ++A, ++B) {
    const int v0 = (A[0] * 9 + A[1] * 3 + B[0] * 3 + B[1] + 8) >> 4;
    const int v1 = (A[1] * 9 + A[0] * 3 + B[1] * 3 + B[0] + 8) >> 4;
    out[2 * i + 0] = clip_y(best_y[2 * i + 0] + v0);
    out[2 * i + 1] = clip_y(best_y[2 * i + 1] + v1);
  }
}